

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  size_t k;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  undefined4 uVar30;
  Geometry *pGVar31;
  Geometry *pGVar32;
  undefined1 (*pauVar33) [32];
  ulong uVar34;
  ulong *puVar35;
  uint uVar36;
  NodeRef root;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar49 [64];
  float fVar50;
  float fVar60;
  float fVar61;
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar62;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  Precalculations pre;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2bf9;
  RayK<8> *local_2bf8;
  ulong local_2bf0;
  BVH *local_2be8;
  Intersectors *local_2be0;
  RayQueryContext *local_2bd8;
  ulong local_2bd0;
  ulong local_2bc8;
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [64];
  undefined1 local_2b40 [32];
  RTCFilterFunctionNArguments local_2b10;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [8];
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  undefined1 local_2a00 [8];
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  undefined1 local_29e0 [8];
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2960;
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  undefined4 uStack_2824;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined4 uStack_2804;
  float local_2800;
  float fStack_27fc;
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined4 uStack_27e4;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  undefined1 local_26a0 [32];
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2be8 = (BVH *)This->ptr;
  if ((local_2be8->root).ptr != 8) {
    auVar65 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar51 = ZEXT816(0) << 0x40;
    auVar63 = vpcmpeqd_avx2(auVar65,(undefined1  [32])valid_i->field_0);
    auVar65 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar51),5);
    auVar43 = auVar63 & auVar65;
    if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar43 >> 0x7f,0) != '\0') ||
          (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar43 >> 0xbf,0) != '\0') ||
        (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar43[0x1f] < '\0')
    {
      auVar65 = vandps_avx(auVar65,auVar63);
      auVar4 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
      local_2960._0_4_ = *(undefined4 *)ray;
      local_2960._4_4_ = *(undefined4 *)(ray + 4);
      local_2960._8_4_ = *(undefined4 *)(ray + 8);
      local_2960._12_4_ = *(undefined4 *)(ray + 0xc);
      local_2960._16_4_ = *(undefined4 *)(ray + 0x10);
      local_2960._20_4_ = *(undefined4 *)(ray + 0x14);
      local_2960._24_4_ = *(undefined4 *)(ray + 0x18);
      local_2960._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2960._32_4_ = *(undefined4 *)(ray + 0x20);
      local_2960._36_4_ = *(undefined4 *)(ray + 0x24);
      local_2960._40_4_ = *(undefined4 *)(ray + 0x28);
      local_2960._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_2960._48_4_ = *(undefined4 *)(ray + 0x30);
      local_2960._52_4_ = *(undefined4 *)(ray + 0x34);
      local_2960._56_4_ = *(undefined4 *)(ray + 0x38);
      local_2960._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2960._64_4_ = *(undefined4 *)(ray + 0x40);
      local_2960._68_4_ = *(undefined4 *)(ray + 0x44);
      local_2960._72_4_ = *(undefined4 *)(ray + 0x48);
      local_2960._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_2960._80_4_ = *(undefined4 *)(ray + 0x50);
      local_2960._84_4_ = *(undefined4 *)(ray + 0x54);
      local_2960._88_4_ = *(undefined4 *)(ray + 0x58);
      local_2960._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_2900 = *(undefined1 (*) [32])(ray + 0x80);
      local_28e0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_28c0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_29a0._8_4_ = 0x7fffffff;
      local_29a0._0_8_ = 0x7fffffff7fffffff;
      local_29a0._12_4_ = 0x7fffffff;
      local_29a0._16_4_ = 0x7fffffff;
      local_29a0._20_4_ = 0x7fffffff;
      local_29a0._24_4_ = 0x7fffffff;
      local_29a0._28_4_ = 0x7fffffff;
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar94._16_4_ = 0x219392ef;
      auVar94._20_4_ = 0x219392ef;
      auVar94._24_4_ = 0x219392ef;
      auVar94._28_4_ = 0x219392ef;
      auVar65 = vandps_avx(local_29a0,local_2900);
      auVar65 = vcmpps_avx(auVar65,auVar94,1);
      auVar43 = vblendvps_avx(local_2900,auVar94,auVar65);
      auVar65 = vandps_avx(local_29a0,local_28e0);
      auVar65 = vcmpps_avx(auVar65,auVar94,1);
      auVar63 = vblendvps_avx(local_28e0,auVar94,auVar65);
      auVar65 = vandps_avx(local_28c0,local_29a0);
      auVar65 = vcmpps_avx(auVar65,auVar94,1);
      auVar65 = vblendvps_avx(local_28c0,auVar94,auVar65);
      auVar64 = vrcpps_avx(auVar43);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = &DAT_3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar95._16_4_ = 0x3f800000;
      auVar95._20_4_ = 0x3f800000;
      auVar95._24_4_ = 0x3f800000;
      auVar95._28_4_ = 0x3f800000;
      auVar16 = vfnmadd213ps_fma(auVar43,auVar64,auVar95);
      auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar64,auVar64);
      auVar43 = vrcpps_avx(auVar63);
      auVar17 = vfnmadd213ps_fma(auVar63,auVar43,auVar95);
      auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar43,auVar43);
      auVar87 = ZEXT1664(auVar17);
      auVar43 = vrcpps_avx(auVar65);
      auVar18 = vfnmadd213ps_fma(auVar65,auVar43,auVar95);
      auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar43,auVar43);
      local_28a0 = ZEXT1632(auVar16);
      local_2880 = ZEXT1632(auVar17);
      local_2860 = ZEXT1632(auVar18);
      local_2840 = auVar16._0_4_ * (float)local_2960._0_4_;
      fStack_283c = auVar16._4_4_ * (float)local_2960._4_4_;
      fStack_2838 = auVar16._8_4_ * (float)local_2960._8_4_;
      fStack_2834 = auVar16._12_4_ * (float)local_2960._12_4_;
      fStack_2830 = (float)local_2960._16_4_ * 0.0;
      fStack_282c = (float)local_2960._20_4_ * 0.0;
      fStack_2828 = (float)local_2960._24_4_ * 0.0;
      local_2820 = (float)local_2960._32_4_ * auVar17._0_4_;
      fStack_281c = (float)local_2960._36_4_ * auVar17._4_4_;
      fStack_2818 = (float)local_2960._40_4_ * auVar17._8_4_;
      fStack_2814 = (float)local_2960._44_4_ * auVar17._12_4_;
      fStack_2810 = (float)local_2960._48_4_ * 0.0;
      fStack_280c = (float)local_2960._52_4_ * 0.0;
      fStack_2808 = (float)local_2960._56_4_ * 0.0;
      local_2800 = (float)local_2960._64_4_ * auVar18._0_4_;
      fStack_27fc = (float)local_2960._68_4_ * auVar18._4_4_;
      fStack_27f8 = (float)local_2960._72_4_ * auVar18._8_4_;
      fStack_27f4 = (float)local_2960._76_4_ * auVar18._12_4_;
      fStack_27f0 = (float)local_2960._80_4_ * 0.0;
      fStack_27ec = (float)local_2960._84_4_ * 0.0;
      fStack_27e8 = (float)local_2960._88_4_ * 0.0;
      auVar65 = vcmpps_avx(local_28a0,ZEXT1632(auVar51),1);
      auVar43._8_4_ = 0x10;
      auVar43._0_8_ = 0x1000000010;
      auVar43._12_4_ = 0x10;
      auVar43._16_4_ = 0x10;
      auVar43._20_4_ = 0x10;
      auVar43._24_4_ = 0x10;
      auVar43._28_4_ = 0x10;
      local_27e0 = vandps_avx(auVar65,auVar43);
      auVar63._8_4_ = 0x20;
      auVar63._0_8_ = 0x2000000020;
      auVar63._12_4_ = 0x20;
      auVar63._16_4_ = 0x20;
      auVar63._20_4_ = 0x20;
      auVar63._24_4_ = 0x20;
      auVar63._28_4_ = 0x20;
      auVar71._8_4_ = 0x30;
      auVar71._0_8_ = 0x3000000030;
      auVar71._12_4_ = 0x30;
      auVar71._16_4_ = 0x30;
      auVar71._20_4_ = 0x30;
      auVar71._24_4_ = 0x30;
      auVar71._28_4_ = 0x30;
      auVar43 = ZEXT1632(auVar51);
      auVar65 = vcmpps_avx(ZEXT1632(auVar17),auVar43,5);
      local_27c0 = vblendvps_avx(auVar71,auVar63,auVar65);
      auVar64._8_4_ = 0x40;
      auVar64._0_8_ = 0x4000000040;
      auVar64._12_4_ = 0x40;
      auVar64._16_4_ = 0x40;
      auVar64._20_4_ = 0x40;
      auVar64._24_4_ = 0x40;
      auVar64._28_4_ = 0x40;
      auVar72._8_4_ = 0x50;
      auVar72._0_8_ = 0x5000000050;
      auVar72._12_4_ = 0x50;
      auVar72._16_4_ = 0x50;
      auVar72._20_4_ = 0x50;
      auVar72._24_4_ = 0x50;
      auVar72._28_4_ = 0x50;
      auVar65 = vcmpps_avx(ZEXT1632(auVar18),auVar43,5);
      local_27a0 = vblendvps_avx(auVar72,auVar64,auVar65);
      auVar65 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar43);
      auVar43 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar43);
      local_2980 = vpmovsxwd_avx2(auVar4);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar101 = ZEXT3264(local_1e80);
      local_2780 = vblendvps_avx(local_1e80,auVar65,local_2980);
      auVar65._8_4_ = 0xff800000;
      auVar65._0_8_ = 0xff800000ff800000;
      auVar65._12_4_ = 0xff800000;
      auVar65._16_4_ = 0xff800000;
      auVar65._20_4_ = 0xff800000;
      auVar65._24_4_ = 0xff800000;
      auVar65._28_4_ = 0xff800000;
      local_2760 = vblendvps_avx(auVar65,auVar43,local_2980);
      auVar51 = vpcmpeqd_avx(local_2760._0_16_,local_2760._0_16_);
      local_2b40 = vpmovsxwd_avx2(auVar4 ^ auVar51);
      auVar49 = ZEXT3264(local_2b40);
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_2bf0 = 5;
        pGVar32 = (Geometry *)context;
      }
      else {
        pGVar32 = (Geometry *)
                  (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT);
        local_2bf0 = (long)pGVar32 * 3 + 2;
      }
      local_2bf8 = ray + 0x100;
      puVar35 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [32])local_1e40;
      local_2608 = (local_2be8->root).ptr;
      local_1e60 = local_2780;
      local_2b80._32_8_ = mm_lookupmask_ps._16_8_;
      local_2b80._40_8_ = mm_lookupmask_ps._24_8_;
      local_2b80._48_8_ = mm_lookupmask_ps._16_8_;
      local_2b80._56_8_ = mm_lookupmask_ps._24_8_;
      local_2be0 = This;
      local_2bd8 = context;
      uStack_2824 = local_2960._28_4_;
      uStack_2804 = local_2960._60_4_;
      uStack_27e4 = local_2960._92_4_;
LAB_005ade59:
      pauVar33 = pauVar33 + -1;
      root.ptr = puVar35[-1];
      puVar35 = puVar35 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_005ae81c;
      local_2ba0 = *pauVar33;
      auVar103 = ZEXT3264(local_2ba0);
      auVar65 = vcmpps_avx(local_2ba0,local_2760,1);
      if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar65 >> 0x7f,0) == '\0') &&
            (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar65 >> 0xbf,0) == '\0') &&
          (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar65[0x1f])
      {
LAB_005ae82d:
        iVar28 = 2;
      }
      else {
        uVar30 = vmovmskps_avx(auVar65);
        pGVar32 = (Geometry *)CONCAT44((int)((ulong)pGVar32 >> 0x20),uVar30);
        iVar28 = 0;
        if ((uint)POPCOUNT(uVar30) <= local_2bf0) {
          auVar65 = vpcmpeqd_avx2(auVar49._0_32_,auVar49._0_32_);
          while (auVar49 = ZEXT3264(auVar65), pGVar32 != (Geometry *)0x0) {
            local_2bc0._0_8_ = pGVar32;
            k = 0;
            for (; ((ulong)pGVar32 & 1) == 0;
                pGVar32 = (Geometry *)((ulong)pGVar32 >> 1 | 0x8000000000000000)) {
              k = k + 1;
            }
            local_2b80._0_8_ = k;
            auVar65 = ZEXT1632(auVar65._0_16_);
            auVar87 = ZEXT1664(auVar87._0_16_);
            bVar39 = occluded1(local_2be0,local_2be8,root,k,&local_2bf9,ray,
                               (TravRayK<8,_false> *)&local_2960.field_0,local_2bd8);
            if (bVar39) {
              *(undefined4 *)(local_2b40 + local_2b80._0_8_ * 4) = 0xffffffff;
            }
            pGVar32 = (Geometry *)(local_2bc0._0_8_ - 1 & local_2bc0._0_8_);
            auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
            auVar103 = ZEXT3264(local_2ba0);
          }
          auVar65 = auVar65 & ~local_2b40;
          iVar28 = 3;
          pGVar32 = (Geometry *)0x0;
          if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0x7f,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0xbf,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar65[0x1f] < '\0') {
            auVar49 = ZEXT3264(local_2760);
            auVar59._8_4_ = 0xff800000;
            auVar59._0_8_ = 0xff800000ff800000;
            auVar59._12_4_ = 0xff800000;
            auVar59._16_4_ = 0xff800000;
            auVar59._20_4_ = 0xff800000;
            auVar59._24_4_ = 0xff800000;
            auVar59._28_4_ = 0xff800000;
            local_2760 = vblendvps_avx(local_2760,auVar59,local_2b40);
            iVar28 = 2;
          }
        }
        if ((uint)local_2bf0 < (uint)POPCOUNT(uVar30)) {
          do {
            uVar36 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005ae81c;
              auVar65 = vcmpps_avx(local_2760,auVar103._0_32_,6);
              if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar65 >> 0x7f,0) == '\0') &&
                    (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar65 >> 0xbf,0) == '\0') &&
                  (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar65[0x1f]) goto LAB_005ae82d;
              uVar34 = (ulong)(uVar36 & 0xf) - 8;
              local_2ba0 = vpcmpeqd_avx2(auVar87._0_32_,auVar87._0_32_);
              auVar87 = ZEXT3264(local_2ba0);
              auVar65 = local_2b40;
              if (uVar34 == 0) goto LAB_005ae7e3;
              local_29c0 = local_2b40;
              local_2ba0 = local_2b40 ^ local_2ba0;
              lVar37 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar29 = 0;
              goto LAB_005ae159;
            }
            uVar29 = root.ptr & 0xfffffffffffffff0;
            auVar65 = vcmpps_avx(local_2760,auVar103._0_32_,6);
            auVar103 = ZEXT3264(auVar101._0_32_);
            uVar34 = 0;
            root.ptr = 8;
            do {
              uVar38 = *(ulong *)(uVar29 + uVar34 * 8);
              if (uVar38 != 8) {
                uVar30 = *(undefined4 *)(uVar29 + 0x80 + uVar34 * 4);
                auVar66._4_4_ = uVar30;
                auVar66._0_4_ = uVar30;
                auVar66._8_4_ = uVar30;
                auVar66._12_4_ = uVar30;
                auVar66._16_4_ = uVar30;
                auVar66._20_4_ = uVar30;
                auVar66._24_4_ = uVar30;
                auVar66._28_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar29 + 0x20 + uVar34 * 4);
                auVar52._4_4_ = uVar30;
                auVar52._0_4_ = uVar30;
                auVar52._8_4_ = uVar30;
                auVar52._12_4_ = uVar30;
                auVar52._16_4_ = uVar30;
                auVar52._20_4_ = uVar30;
                auVar52._24_4_ = uVar30;
                auVar52._28_4_ = uVar30;
                auVar43 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar30 = *(undefined4 *)(uVar29 + 0xa0 + uVar34 * 4);
                auVar73._4_4_ = uVar30;
                auVar73._0_4_ = uVar30;
                auVar73._8_4_ = uVar30;
                auVar73._12_4_ = uVar30;
                auVar73._16_4_ = uVar30;
                auVar73._20_4_ = uVar30;
                auVar73._24_4_ = uVar30;
                auVar73._28_4_ = uVar30;
                auVar51 = vfmadd231ps_fma(auVar52,auVar43,auVar66);
                uVar30 = *(undefined4 *)(uVar29 + 0x40 + uVar34 * 4);
                auVar67._4_4_ = uVar30;
                auVar67._0_4_ = uVar30;
                auVar67._8_4_ = uVar30;
                auVar67._12_4_ = uVar30;
                auVar67._16_4_ = uVar30;
                auVar67._20_4_ = uVar30;
                auVar67._24_4_ = uVar30;
                auVar67._28_4_ = uVar30;
                auVar4 = vfmadd231ps_fma(auVar67,auVar43,auVar73);
                uVar30 = *(undefined4 *)(uVar29 + 0xc0 + uVar34 * 4);
                auVar76._4_4_ = uVar30;
                auVar76._0_4_ = uVar30;
                auVar76._8_4_ = uVar30;
                auVar76._12_4_ = uVar30;
                auVar76._16_4_ = uVar30;
                auVar76._20_4_ = uVar30;
                auVar76._24_4_ = uVar30;
                auVar76._28_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar29 + 0x60 + uVar34 * 4);
                auVar74._4_4_ = uVar30;
                auVar74._0_4_ = uVar30;
                auVar74._8_4_ = uVar30;
                auVar74._12_4_ = uVar30;
                auVar74._16_4_ = uVar30;
                auVar74._20_4_ = uVar30;
                auVar74._24_4_ = uVar30;
                auVar74._28_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar29 + 0x90 + uVar34 * 4);
                auVar83._4_4_ = uVar30;
                auVar83._0_4_ = uVar30;
                auVar83._8_4_ = uVar30;
                auVar83._12_4_ = uVar30;
                auVar83._16_4_ = uVar30;
                auVar83._20_4_ = uVar30;
                auVar83._24_4_ = uVar30;
                auVar83._28_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar29 + 0x30 + uVar34 * 4);
                auVar80._4_4_ = uVar30;
                auVar80._0_4_ = uVar30;
                auVar80._8_4_ = uVar30;
                auVar80._12_4_ = uVar30;
                auVar80._16_4_ = uVar30;
                auVar80._20_4_ = uVar30;
                auVar80._24_4_ = uVar30;
                auVar80._28_4_ = uVar30;
                auVar16 = vfmadd231ps_fma(auVar74,auVar43,auVar76);
                auVar17 = vfmadd231ps_fma(auVar80,auVar43,auVar83);
                uVar30 = *(undefined4 *)(uVar29 + 0xb0 + uVar34 * 4);
                auVar77._4_4_ = uVar30;
                auVar77._0_4_ = uVar30;
                auVar77._8_4_ = uVar30;
                auVar77._12_4_ = uVar30;
                auVar77._16_4_ = uVar30;
                auVar77._20_4_ = uVar30;
                auVar77._24_4_ = uVar30;
                auVar77._28_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar29 + 0x50 + uVar34 * 4);
                auVar84._4_4_ = uVar30;
                auVar84._0_4_ = uVar30;
                auVar84._8_4_ = uVar30;
                auVar84._12_4_ = uVar30;
                auVar84._16_4_ = uVar30;
                auVar84._20_4_ = uVar30;
                auVar84._24_4_ = uVar30;
                auVar84._28_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar29 + 0xd0 + uVar34 * 4);
                auVar88._4_4_ = uVar30;
                auVar88._0_4_ = uVar30;
                auVar88._8_4_ = uVar30;
                auVar88._12_4_ = uVar30;
                auVar88._16_4_ = uVar30;
                auVar88._20_4_ = uVar30;
                auVar88._24_4_ = uVar30;
                auVar88._28_4_ = uVar30;
                auVar18 = vfmadd231ps_fma(auVar84,auVar43,auVar77);
                uVar30 = *(undefined4 *)(uVar29 + 0x70 + uVar34 * 4);
                auVar92._4_4_ = uVar30;
                auVar92._0_4_ = uVar30;
                auVar92._8_4_ = uVar30;
                auVar92._12_4_ = uVar30;
                auVar92._16_4_ = uVar30;
                auVar92._20_4_ = uVar30;
                auVar92._24_4_ = uVar30;
                auVar92._28_4_ = uVar30;
                auVar12 = vfmadd231ps_fma(auVar92,auVar43,auVar88);
                auVar25._4_4_ = fStack_283c;
                auVar25._0_4_ = local_2840;
                auVar25._8_4_ = fStack_2838;
                auVar25._12_4_ = fStack_2834;
                auVar25._16_4_ = fStack_2830;
                auVar25._20_4_ = fStack_282c;
                auVar25._24_4_ = fStack_2828;
                auVar25._28_4_ = uStack_2824;
                auVar51 = vfmsub213ps_fma(ZEXT1632(auVar51),local_28a0,auVar25);
                auVar26._4_4_ = fStack_281c;
                auVar26._0_4_ = local_2820;
                auVar26._8_4_ = fStack_2818;
                auVar26._12_4_ = fStack_2814;
                auVar26._16_4_ = fStack_2810;
                auVar26._20_4_ = fStack_280c;
                auVar26._24_4_ = fStack_2808;
                auVar26._28_4_ = uStack_2804;
                auVar4 = vfmsub213ps_fma(ZEXT1632(auVar4),local_2880,auVar26);
                auVar27._4_4_ = fStack_27fc;
                auVar27._0_4_ = local_2800;
                auVar27._8_4_ = fStack_27f8;
                auVar27._12_4_ = fStack_27f4;
                auVar27._16_4_ = fStack_27f0;
                auVar27._20_4_ = fStack_27ec;
                auVar27._24_4_ = fStack_27e8;
                auVar27._28_4_ = uStack_27e4;
                auVar16 = vfmsub213ps_fma(ZEXT1632(auVar16),local_2860,auVar27);
                auVar17 = vfmsub213ps_fma(ZEXT1632(auVar17),local_28a0,auVar25);
                auVar18 = vfmsub213ps_fma(ZEXT1632(auVar18),local_2880,auVar26);
                auVar87 = ZEXT1664(auVar18);
                auVar12 = vfmsub213ps_fma(ZEXT1632(auVar12),local_2860,auVar27);
                auVar63 = vpminsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar17));
                auVar64 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar18));
                auVar63 = vpmaxsd_avx2(auVar63,auVar64);
                auVar64 = vpminsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar12));
                auVar64 = vpmaxsd_avx2(auVar63,auVar64);
                auVar63 = vpmaxsd_avx2(ZEXT1632(auVar51),ZEXT1632(auVar17));
                auVar71 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar18));
                auVar71 = vpminsd_avx2(auVar63,auVar71);
                auVar63 = vpmaxsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar12));
                auVar71 = vpminsd_avx2(auVar71,auVar63);
                auVar63 = vpmaxsd_avx2(auVar64,local_2780);
                auVar71 = vpminsd_avx2(auVar71,local_2760);
                auVar63 = vcmpps_avx(auVar63,auVar71,2);
                if ((uVar36 & 7) == 6) {
                  uVar30 = *(undefined4 *)(uVar29 + 0xe0 + uVar34 * 4);
                  auVar68._4_4_ = uVar30;
                  auVar68._0_4_ = uVar30;
                  auVar68._8_4_ = uVar30;
                  auVar68._12_4_ = uVar30;
                  auVar68._16_4_ = uVar30;
                  auVar68._20_4_ = uVar30;
                  auVar68._24_4_ = uVar30;
                  auVar68._28_4_ = uVar30;
                  auVar71 = vcmpps_avx(auVar68,auVar43,2);
                  uVar30 = *(undefined4 *)(uVar29 + 0xf0 + uVar34 * 4);
                  auVar75._4_4_ = uVar30;
                  auVar75._0_4_ = uVar30;
                  auVar75._8_4_ = uVar30;
                  auVar75._12_4_ = uVar30;
                  auVar75._16_4_ = uVar30;
                  auVar75._20_4_ = uVar30;
                  auVar75._24_4_ = uVar30;
                  auVar75._28_4_ = uVar30;
                  auVar43 = vcmpps_avx(auVar43,auVar75,1);
                  auVar43 = vandps_avx(auVar71,auVar43);
                  auVar43 = vandps_avx(auVar43,auVar63);
                  auVar51 = vpackssdw_avx(auVar43._0_16_,auVar43._16_16_);
                }
                else {
                  auVar51 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
                }
                auVar4 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
                auVar51 = vpand_avx(auVar51,auVar4);
                auVar43 = vpmovzxwd_avx2(auVar51);
                auVar43 = vpslld_avx2(auVar43,0x1f);
                auVar49 = ZEXT3264(auVar43);
                if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar43 >> 0x7f,0) != '\0') ||
                      (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar43 >> 0xbf,0) != '\0') ||
                    (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar43[0x1f] < '\0') {
                  auVar43 = vblendvps_avx(auVar101._0_32_,auVar64,auVar43);
                  auVar49 = ZEXT3264(auVar43);
                  if (root.ptr != 8) {
                    *puVar35 = root.ptr;
                    puVar35 = puVar35 + 1;
                    *pauVar33 = auVar103._0_32_;
                    pauVar33 = pauVar33 + 1;
                  }
                  auVar103 = ZEXT3264(auVar43);
                  root.ptr = uVar38;
                }
              }
            } while ((uVar38 != 8) && (bVar39 = uVar34 < 3, uVar34 = uVar34 + 1, bVar39));
            iVar28 = 0;
            if (root.ptr == 8) {
LAB_005ae0f7:
              pGVar32 = (Geometry *)0x0;
              iVar28 = 4;
            }
            else {
              auVar65 = vcmpps_avx(local_2760,auVar103._0_32_,6);
              uVar30 = vmovmskps_avx(auVar65);
              pGVar32 = (Geometry *)0x1;
              if ((uint)POPCOUNT(uVar30) <= (uint)local_2bf0) {
                *puVar35 = root.ptr;
                puVar35 = puVar35 + 1;
                *pauVar33 = auVar103._0_32_;
                pauVar33 = pauVar33 + 1;
                goto LAB_005ae0f7;
              }
            }
          } while ((char)pGVar32 != '\0');
        }
      }
      goto LAB_005ae81f;
    }
  }
  return;
  while( true ) {
    uVar29 = uVar29 + 1;
    lVar37 = lVar37 + 0x140;
    if (uVar34 <= uVar29) break;
LAB_005ae159:
    auVar49 = ZEXT3264(local_2ba0);
    uVar38 = 0;
    local_2bd0 = uVar29;
    auVar65 = local_2ba0;
    while( true ) {
      auVar43 = auVar49._0_32_;
      uVar36 = *(uint *)(lVar37 + -0x10 + uVar38 * 4);
      pGVar32 = (Geometry *)0x0;
      if ((ulong)uVar36 == 0xffffffff) break;
      auVar43 = *(undefined1 (*) [32])(ray + 0x80);
      auVar63 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar64 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar30 = *(undefined4 *)(lVar37 + -0xa0 + uVar38 * 4);
      auVar44._4_4_ = uVar30;
      auVar44._0_4_ = uVar30;
      auVar44._8_4_ = uVar30;
      auVar44._12_4_ = uVar30;
      auVar44._16_4_ = uVar30;
      auVar44._20_4_ = uVar30;
      auVar44._24_4_ = uVar30;
      auVar44._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x90 + uVar38 * 4);
      auVar53._4_4_ = uVar30;
      auVar53._0_4_ = uVar30;
      auVar53._8_4_ = uVar30;
      auVar53._12_4_ = uVar30;
      auVar53._16_4_ = uVar30;
      auVar53._20_4_ = uVar30;
      auVar53._24_4_ = uVar30;
      auVar53._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x80 + uVar38 * 4);
      auVar85._4_4_ = uVar30;
      auVar85._0_4_ = uVar30;
      auVar85._8_4_ = uVar30;
      auVar85._12_4_ = uVar30;
      auVar85._16_4_ = uVar30;
      auVar85._20_4_ = uVar30;
      auVar85._24_4_ = uVar30;
      auVar85._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x130 + uVar38 * 4);
      auVar78._4_4_ = uVar30;
      auVar78._0_4_ = uVar30;
      auVar78._8_4_ = uVar30;
      auVar78._12_4_ = uVar30;
      auVar78._16_4_ = uVar30;
      auVar78._20_4_ = uVar30;
      auVar78._24_4_ = uVar30;
      auVar78._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x120 + uVar38 * 4);
      auVar81._4_4_ = uVar30;
      auVar81._0_4_ = uVar30;
      auVar81._8_4_ = uVar30;
      auVar81._12_4_ = uVar30;
      auVar81._16_4_ = uVar30;
      auVar81._20_4_ = uVar30;
      auVar81._24_4_ = uVar30;
      auVar81._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x110 + uVar38 * 4);
      auVar96._4_4_ = uVar30;
      auVar96._0_4_ = uVar30;
      auVar96._8_4_ = uVar30;
      auVar96._12_4_ = uVar30;
      auVar96._16_4_ = uVar30;
      auVar96._20_4_ = uVar30;
      auVar96._24_4_ = uVar30;
      auVar96._28_4_ = uVar30;
      auVar51 = vfmadd231ps_fma(auVar78,auVar64,auVar44);
      auVar4 = vfmadd231ps_fma(auVar81,auVar64,auVar53);
      uVar30 = *(undefined4 *)(lVar37 + -0x70 + uVar38 * 4);
      auVar45._4_4_ = uVar30;
      auVar45._0_4_ = uVar30;
      auVar45._8_4_ = uVar30;
      auVar45._12_4_ = uVar30;
      auVar45._16_4_ = uVar30;
      auVar45._20_4_ = uVar30;
      auVar45._24_4_ = uVar30;
      auVar45._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x60 + uVar38 * 4);
      auVar54._4_4_ = uVar30;
      auVar54._0_4_ = uVar30;
      auVar54._8_4_ = uVar30;
      auVar54._12_4_ = uVar30;
      auVar54._16_4_ = uVar30;
      auVar54._20_4_ = uVar30;
      auVar54._24_4_ = uVar30;
      auVar54._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x50 + uVar38 * 4);
      auVar89._4_4_ = uVar30;
      auVar89._0_4_ = uVar30;
      auVar89._8_4_ = uVar30;
      auVar89._12_4_ = uVar30;
      auVar89._16_4_ = uVar30;
      auVar89._20_4_ = uVar30;
      auVar89._24_4_ = uVar30;
      auVar89._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0x100 + uVar38 * 4);
      auVar93._4_4_ = uVar30;
      auVar93._0_4_ = uVar30;
      auVar93._8_4_ = uVar30;
      auVar93._12_4_ = uVar30;
      auVar93._16_4_ = uVar30;
      auVar93._20_4_ = uVar30;
      auVar93._24_4_ = uVar30;
      auVar93._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0xf0 + uVar38 * 4);
      auVar97._4_4_ = uVar30;
      auVar97._0_4_ = uVar30;
      auVar97._8_4_ = uVar30;
      auVar97._12_4_ = uVar30;
      auVar97._16_4_ = uVar30;
      auVar97._20_4_ = uVar30;
      auVar97._24_4_ = uVar30;
      auVar97._28_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar37 + -0xe0 + uVar38 * 4);
      auVar98._4_4_ = uVar30;
      auVar98._0_4_ = uVar30;
      auVar98._8_4_ = uVar30;
      auVar98._12_4_ = uVar30;
      auVar98._16_4_ = uVar30;
      auVar98._20_4_ = uVar30;
      auVar98._24_4_ = uVar30;
      auVar98._28_4_ = uVar30;
      auVar16 = vfmadd231ps_fma(auVar96,auVar64,auVar85);
      auVar17 = vfmadd231ps_fma(auVar93,auVar64,auVar45);
      auVar18 = vfmadd231ps_fma(auVar97,auVar64,auVar54);
      auVar12 = vfmadd231ps_fma(auVar98,auVar64,auVar89);
      uVar30 = *(undefined4 *)(lVar37 + -0x40 + uVar38 * 4);
      auVar46._4_4_ = uVar30;
      auVar46._0_4_ = uVar30;
      auVar46._8_4_ = uVar30;
      auVar46._12_4_ = uVar30;
      auVar46._16_4_ = uVar30;
      auVar46._20_4_ = uVar30;
      auVar46._24_4_ = uVar30;
      auVar46._28_4_ = uVar30;
      uVar1 = *(undefined4 *)(lVar37 + -0x30 + uVar38 * 4);
      auVar55._4_4_ = uVar1;
      auVar55._0_4_ = uVar1;
      auVar55._8_4_ = uVar1;
      auVar55._12_4_ = uVar1;
      auVar55._16_4_ = uVar1;
      auVar55._20_4_ = uVar1;
      auVar55._24_4_ = uVar1;
      auVar55._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar37 + -0x20 + uVar38 * 4);
      auVar86._4_4_ = uVar1;
      auVar86._0_4_ = uVar1;
      auVar86._8_4_ = uVar1;
      auVar86._12_4_ = uVar1;
      auVar86._16_4_ = uVar1;
      auVar86._20_4_ = uVar1;
      auVar86._24_4_ = uVar1;
      auVar86._28_4_ = uVar1;
      uVar2 = *(undefined4 *)(lVar37 + -0xd0 + uVar38 * 4);
      auVar100._4_4_ = uVar2;
      auVar100._0_4_ = uVar2;
      auVar100._8_4_ = uVar2;
      auVar100._12_4_ = uVar2;
      auVar100._16_4_ = uVar2;
      auVar100._20_4_ = uVar2;
      auVar100._24_4_ = uVar2;
      auVar100._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar37 + -0xc0 + uVar38 * 4);
      auVar102._4_4_ = uVar2;
      auVar102._0_4_ = uVar2;
      auVar102._8_4_ = uVar2;
      auVar102._12_4_ = uVar2;
      auVar102._16_4_ = uVar2;
      auVar102._20_4_ = uVar2;
      auVar102._24_4_ = uVar2;
      auVar102._28_4_ = uVar2;
      uVar2 = *(undefined4 *)(lVar37 + -0xb0 + uVar38 * 4);
      auVar90._4_4_ = uVar2;
      auVar90._0_4_ = uVar2;
      auVar90._8_4_ = uVar2;
      auVar90._12_4_ = uVar2;
      auVar90._16_4_ = uVar2;
      auVar90._20_4_ = uVar2;
      auVar90._24_4_ = uVar2;
      auVar90._28_4_ = uVar2;
      auVar71 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar13 = vfmadd231ps_fma(auVar100,auVar64,auVar46);
      auVar14 = vfmadd231ps_fma(auVar102,auVar64,auVar55);
      auVar15 = vfmadd231ps_fma(auVar90,auVar64,auVar86);
      auVar64 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar17));
      auVar72 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar18));
      auVar94 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar12));
      auVar95 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar51));
      auVar59 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar4));
      auVar44 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar91._0_4_ = auVar72._0_4_ * auVar44._0_4_;
      auVar91._4_4_ = auVar72._4_4_ * auVar44._4_4_;
      auVar91._8_4_ = auVar72._8_4_ * auVar44._8_4_;
      auVar91._12_4_ = auVar72._12_4_ * auVar44._12_4_;
      auVar91._16_4_ = auVar72._16_4_ * auVar44._16_4_;
      auVar91._20_4_ = auVar72._20_4_ * auVar44._20_4_;
      auVar91._24_4_ = auVar72._24_4_ * auVar44._24_4_;
      auVar91._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar91,auVar59,auVar94);
      auVar5._4_4_ = auVar94._4_4_ * auVar95._4_4_;
      auVar5._0_4_ = auVar94._0_4_ * auVar95._0_4_;
      auVar5._8_4_ = auVar94._8_4_ * auVar95._8_4_;
      auVar5._12_4_ = auVar94._12_4_ * auVar95._12_4_;
      auVar5._16_4_ = auVar94._16_4_ * auVar95._16_4_;
      auVar5._20_4_ = auVar94._20_4_ * auVar95._20_4_;
      auVar5._24_4_ = auVar94._24_4_ * auVar95._24_4_;
      auVar5._28_4_ = uVar1;
      auVar18 = vfmsub231ps_fma(auVar5,auVar44,auVar64);
      auVar6._4_4_ = auVar59._4_4_ * auVar64._4_4_;
      auVar6._0_4_ = auVar59._0_4_ * auVar64._0_4_;
      auVar6._8_4_ = auVar59._8_4_ * auVar64._8_4_;
      auVar6._12_4_ = auVar59._12_4_ * auVar64._12_4_;
      auVar6._16_4_ = auVar59._16_4_ * auVar64._16_4_;
      auVar6._20_4_ = auVar59._20_4_ * auVar64._20_4_;
      auVar6._24_4_ = auVar59._24_4_ * auVar64._24_4_;
      auVar6._28_4_ = uVar30;
      auVar12 = vfmsub231ps_fma(auVar6,auVar95,auVar72);
      auVar5 = vsubps_avx(ZEXT1632(auVar51),*(undefined1 (*) [32])ray);
      auVar6 = vsubps_avx(ZEXT1632(auVar4),*(undefined1 (*) [32])(ray + 0x20));
      auVar45 = vsubps_avx(ZEXT1632(auVar16),*(undefined1 (*) [32])(ray + 0x40));
      auVar19._4_4_ = auVar43._4_4_ * auVar6._4_4_;
      auVar19._0_4_ = auVar43._0_4_ * auVar6._0_4_;
      auVar19._8_4_ = auVar43._8_4_ * auVar6._8_4_;
      auVar19._12_4_ = auVar43._12_4_ * auVar6._12_4_;
      auVar19._16_4_ = auVar43._16_4_ * auVar6._16_4_;
      auVar19._20_4_ = auVar43._20_4_ * auVar6._20_4_;
      auVar19._24_4_ = auVar43._24_4_ * auVar6._24_4_;
      auVar19._28_4_ = auVar64._28_4_;
      auVar16 = vfmsub231ps_fma(auVar19,auVar5,auVar63);
      auVar82._0_4_ = auVar71._0_4_ * auVar12._0_4_;
      auVar82._4_4_ = auVar71._4_4_ * auVar12._4_4_;
      auVar82._8_4_ = auVar71._8_4_ * auVar12._8_4_;
      auVar82._12_4_ = auVar71._12_4_ * auVar12._12_4_;
      auVar82._16_4_ = auVar71._16_4_ * 0.0;
      auVar82._20_4_ = auVar71._20_4_ * 0.0;
      auVar82._24_4_ = auVar71._24_4_ * 0.0;
      auVar82._28_4_ = 0;
      auVar51 = vfmadd231ps_fma(auVar82,ZEXT1632(auVar18),auVar63);
      auVar20._4_4_ = auVar45._4_4_ * auVar63._4_4_;
      auVar20._0_4_ = auVar45._0_4_ * auVar63._0_4_;
      auVar20._8_4_ = auVar45._8_4_ * auVar63._8_4_;
      auVar20._12_4_ = auVar45._12_4_ * auVar63._12_4_;
      auVar20._16_4_ = auVar45._16_4_ * auVar63._16_4_;
      auVar20._20_4_ = auVar45._20_4_ * auVar63._20_4_;
      auVar20._24_4_ = auVar45._24_4_ * auVar63._24_4_;
      auVar20._28_4_ = auVar63._28_4_;
      auVar13 = vfmsub231ps_fma(auVar20,auVar6,auVar71);
      auVar21._4_4_ = auVar71._4_4_ * auVar5._4_4_;
      auVar21._0_4_ = auVar71._0_4_ * auVar5._0_4_;
      auVar21._8_4_ = auVar71._8_4_ * auVar5._8_4_;
      auVar21._12_4_ = auVar71._12_4_ * auVar5._12_4_;
      auVar21._16_4_ = auVar71._16_4_ * auVar5._16_4_;
      auVar21._20_4_ = auVar71._20_4_ * auVar5._20_4_;
      auVar21._24_4_ = auVar71._24_4_ * auVar5._24_4_;
      auVar21._28_4_ = auVar71._28_4_;
      auVar14 = vfmsub231ps_fma(auVar21,auVar45,auVar43);
      auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),ZEXT1632(auVar17),auVar43);
      auVar22._4_4_ = auVar44._4_4_ * auVar16._4_4_;
      auVar22._0_4_ = auVar44._0_4_ * auVar16._0_4_;
      auVar22._8_4_ = auVar44._8_4_ * auVar16._8_4_;
      auVar22._12_4_ = auVar44._12_4_ * auVar16._12_4_;
      auVar22._16_4_ = auVar44._16_4_ * 0.0;
      auVar22._20_4_ = auVar44._20_4_ * 0.0;
      auVar22._24_4_ = auVar44._24_4_ * 0.0;
      auVar22._28_4_ = auVar44._28_4_;
      auVar4 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar14),auVar59);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar69._16_4_ = 0x80000000;
      auVar69._20_4_ = 0x80000000;
      auVar69._24_4_ = 0x80000000;
      auVar69._28_4_ = 0x80000000;
      auVar43 = vandps_avx(ZEXT1632(auVar51),auVar69);
      auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar13),auVar95);
      uVar7 = auVar43._0_4_;
      auVar99._0_4_ = auVar4._0_4_ ^ uVar7;
      uVar8 = auVar43._4_4_;
      auVar99._4_4_ = auVar4._4_4_ ^ uVar8;
      uVar9 = auVar43._8_4_;
      auVar99._8_4_ = auVar4._8_4_ ^ uVar9;
      uVar10 = auVar43._12_4_;
      auVar99._12_4_ = auVar4._12_4_ ^ uVar10;
      uVar30 = auVar43._16_4_;
      auVar99._16_4_ = uVar30;
      uVar1 = auVar43._20_4_;
      auVar99._20_4_ = uVar1;
      uVar2 = auVar43._24_4_;
      auVar99._24_4_ = uVar2;
      uVar11 = auVar43._28_4_;
      auVar99._28_4_ = uVar11;
      auVar43 = vcmpps_avx(auVar99,_DAT_02020f00,5);
      auVar63 = auVar65 & auVar43;
      auVar71 = ZEXT1632(auVar18);
      if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar63 >> 0x7f,0) == '\0') &&
            (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar63 >> 0xbf,0) == '\0') &&
          (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar63[0x1f])
      {
LAB_005ae325:
        auVar3._8_8_ = local_2b80._40_8_;
        auVar3._0_8_ = local_2b80._32_8_;
        auVar3._16_8_ = local_2b80._48_8_;
        auVar3._24_8_ = local_2b80._56_8_;
      }
      else {
        auVar43 = vandps_avx(auVar43,auVar65);
        auVar41._0_4_ = auVar94._0_4_ * auVar16._0_4_;
        auVar41._4_4_ = auVar94._4_4_ * auVar16._4_4_;
        auVar41._8_4_ = auVar94._8_4_ * auVar16._8_4_;
        auVar41._12_4_ = auVar94._12_4_ * auVar16._12_4_;
        auVar41._16_4_ = auVar94._16_4_ * 0.0;
        auVar41._20_4_ = auVar94._20_4_ * 0.0;
        auVar41._24_4_ = auVar94._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar4 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar72,auVar41);
        auVar4 = vfmadd132ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar4),auVar64);
        auVar47._0_4_ = uVar7 ^ auVar4._0_4_;
        auVar47._4_4_ = uVar8 ^ auVar4._4_4_;
        auVar47._8_4_ = uVar9 ^ auVar4._8_4_;
        auVar47._12_4_ = uVar10 ^ auVar4._12_4_;
        auVar47._16_4_ = uVar30;
        auVar47._20_4_ = uVar1;
        auVar47._24_4_ = uVar2;
        auVar47._28_4_ = uVar11;
        auVar63 = vcmpps_avx(auVar47,_DAT_02020f00,5);
        auVar72 = auVar43 & auVar63;
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar72 >> 0x7f,0) == '\0') &&
              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar72 >> 0xbf,0) == '\0') &&
            (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar72[0x1f]) goto LAB_005ae325;
        auVar72 = vandps_avx(ZEXT1632(auVar51),local_29a0);
        auVar43 = vandps_avx(auVar43,auVar63);
        auVar63 = vsubps_avx(auVar72,auVar99);
        auVar63 = vcmpps_avx(auVar63,auVar47,5);
        auVar94 = auVar43 & auVar63;
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0x7f,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0xbf,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar94[0x1f]) goto LAB_005ae325;
        auVar63 = vandps_avx(auVar63,auVar43);
        auVar23._4_4_ = auVar45._4_4_ * auVar12._4_4_;
        auVar23._0_4_ = auVar45._0_4_ * auVar12._0_4_;
        auVar23._8_4_ = auVar45._8_4_ * auVar12._8_4_;
        auVar23._12_4_ = auVar45._12_4_ * auVar12._12_4_;
        auVar23._16_4_ = auVar45._16_4_ * 0.0;
        auVar23._20_4_ = auVar45._20_4_ * 0.0;
        auVar23._24_4_ = auVar45._24_4_ * 0.0;
        auVar23._28_4_ = auVar43._28_4_;
        auVar4 = vfmadd213ps_fma(auVar6,ZEXT1632(auVar18),auVar23);
        auVar4 = vfmadd213ps_fma(auVar5,ZEXT1632(auVar17),ZEXT1632(auVar4));
        auVar42._0_4_ = uVar7 ^ auVar4._0_4_;
        auVar42._4_4_ = uVar8 ^ auVar4._4_4_;
        auVar42._8_4_ = uVar9 ^ auVar4._8_4_;
        auVar42._12_4_ = uVar10 ^ auVar4._12_4_;
        auVar42._16_4_ = uVar30;
        auVar42._20_4_ = uVar1;
        auVar42._24_4_ = uVar2;
        auVar42._28_4_ = uVar11;
        auVar24._4_4_ = auVar72._4_4_ * *(float *)(ray + 100);
        auVar24._0_4_ = auVar72._0_4_ * *(float *)(ray + 0x60);
        auVar24._8_4_ = auVar72._8_4_ * *(float *)(ray + 0x68);
        auVar24._12_4_ = auVar72._12_4_ * *(float *)(ray + 0x6c);
        auVar24._16_4_ = auVar72._16_4_ * *(float *)(ray + 0x70);
        auVar24._20_4_ = auVar72._20_4_ * *(float *)(ray + 0x74);
        auVar24._24_4_ = auVar72._24_4_ * *(float *)(ray + 0x78);
        auVar24._28_4_ = uVar11;
        auVar79._0_4_ = auVar72._0_4_ * *(float *)(ray + 0x100);
        auVar79._4_4_ = auVar72._4_4_ * *(float *)(ray + 0x104);
        auVar79._8_4_ = auVar72._8_4_ * *(float *)(ray + 0x108);
        auVar79._12_4_ = auVar72._12_4_ * *(float *)(ray + 0x10c);
        auVar79._16_4_ = auVar72._16_4_ * *(float *)(ray + 0x110);
        auVar79._20_4_ = auVar72._20_4_ * *(float *)(ray + 0x114);
        auVar79._24_4_ = auVar72._24_4_ * *(float *)(ray + 0x118);
        auVar79._28_4_ = 0;
        auVar43 = vcmpps_avx(auVar24,auVar42,1);
        auVar94 = vcmpps_avx(auVar42,auVar79,2);
        auVar43 = vandps_avx(auVar94,auVar43);
        auVar94 = auVar63 & auVar43;
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0x7f,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0xbf,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar94[0x1f]) goto LAB_005ae325;
        auVar43 = vandps_avx(auVar43,auVar63);
        auVar63 = vcmpps_avx(ZEXT1632(auVar51),_DAT_02020f00,4);
        auVar94 = auVar43 & auVar63;
        if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0x7f,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar94 >> 0xbf,0) == '\0') &&
            (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar94[0x1f]) goto LAB_005ae325;
        auVar3 = vandps_avx(auVar63,auVar43);
        local_2a60 = ZEXT1632(auVar17);
        local_2aa0 = ZEXT1632(auVar12);
        local_2a80 = auVar71;
        local_2a40 = auVar72;
        _local_2a20 = auVar42;
        _local_2a00 = auVar47;
        _local_29e0 = auVar99;
      }
      auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar63 = vpcmpeqd_avx2(auVar71,auVar71);
      auVar87 = ZEXT3264(auVar63);
      pGVar32 = (local_2bd8->scene->geometries).items[uVar36].ptr;
      local_2b80._8_24_ = auVar64._8_24_;
      local_2b80._0_8_ = pGVar32;
      uVar7 = pGVar32->mask;
      auVar40._4_4_ = uVar7;
      auVar40._0_4_ = uVar7;
      auVar40._8_4_ = uVar7;
      auVar40._12_4_ = uVar7;
      auVar40._16_4_ = uVar7;
      auVar40._20_4_ = uVar7;
      auVar40._24_4_ = uVar7;
      auVar40._28_4_ = uVar7;
      auVar43 = vpand_avx2(auVar40,*(undefined1 (*) [32])(ray + 0x120));
      auVar64 = vpcmpeqd_avx2(auVar43,_DAT_02020f00);
      auVar43 = auVar3 & ~auVar64;
      local_2bc0 = auVar65;
      if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar43 >> 0x7f,0) == '\0') &&
            (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar43 >> 0xbf,0) == '\0') &&
          (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar43[0x1f])
      {
        auVar49 = ZEXT3264(local_2ba0);
      }
      else {
        uVar30 = *(undefined4 *)(lVar37 + uVar38 * 4);
        pGVar31 = (Geometry *)0x0;
        auVar65 = vandnps_avx(auVar64,auVar3);
        if ((local_2bd8->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar32->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar49 = ZEXT3264(local_2ba0);
        }
        else {
          auVar43 = vrcpps_avx(local_2a40);
          auVar70._8_4_ = 0x3f800000;
          auVar70._0_8_ = &DAT_3f8000003f800000;
          auVar70._12_4_ = 0x3f800000;
          auVar70._16_4_ = 0x3f800000;
          auVar70._20_4_ = 0x3f800000;
          auVar70._24_4_ = 0x3f800000;
          auVar70._28_4_ = 0x3f800000;
          auVar51 = vfnmadd213ps_fma(auVar43,local_2a40,auVar70);
          auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar43,auVar43);
          fVar50 = auVar51._0_4_;
          local_26e0 = fVar50 * (float)local_29e0._0_4_;
          fVar60 = auVar51._4_4_;
          fStack_26dc = fVar60 * (float)local_29e0._4_4_;
          fVar61 = auVar51._8_4_;
          fStack_26d8 = fVar61 * fStack_29d8;
          fVar62 = auVar51._12_4_;
          fStack_26d4 = fVar62 * fStack_29d4;
          fStack_26d0 = fStack_29d0 * 0.0;
          fStack_26cc = fStack_29cc * 0.0;
          uStack_26c4 = auVar43._28_4_;
          fStack_26c8 = fStack_29c8 * 0.0;
          local_26c0 = fVar50 * (float)local_2a00._0_4_;
          fStack_26bc = fVar60 * (float)local_2a00._4_4_;
          fStack_26b8 = fVar61 * fStack_29f8;
          fStack_26b4 = fVar62 * fStack_29f4;
          fStack_26b0 = fStack_29f0 * 0.0;
          fStack_26ac = fStack_29ec * 0.0;
          fStack_26a8 = fStack_29e8 * 0.0;
          local_26a0._4_4_ = uVar30;
          local_26a0._0_4_ = uVar30;
          local_26a0._8_4_ = uVar30;
          local_26a0._12_4_ = uVar30;
          local_26a0._16_4_ = uVar30;
          local_26a0._20_4_ = uVar30;
          local_26a0._24_4_ = uVar30;
          local_26a0._28_4_ = uVar30;
          local_2740 = local_2a60._0_8_;
          uStack_2738 = local_2a60._8_8_;
          uStack_2730 = local_2a60._16_8_;
          uStack_2728 = local_2a60._24_8_;
          local_2720 = local_2a80._0_8_;
          uStack_2718 = local_2a80._8_8_;
          uStack_2710 = local_2a80._16_8_;
          uStack_2708 = local_2a80._24_8_;
          local_2700 = local_2aa0;
          uStack_26a4 = 0x3f800000;
          local_2660._4_4_ = local_2bd8->user->instID[0];
          auVar56._0_4_ = fVar50 * (float)local_2a20._0_4_;
          auVar56._4_4_ = fVar60 * (float)local_2a20._4_4_;
          auVar56._8_4_ = fVar61 * fStack_2a18;
          auVar56._12_4_ = fVar62 * fStack_2a14;
          auVar56._16_4_ = fStack_2a10 * 0.0;
          auVar56._20_4_ = fStack_2a0c * 0.0;
          auVar56._24_4_ = fStack_2a08 * 0.0;
          auVar56._28_4_ = 0;
          local_2660._0_4_ = local_2660._4_4_;
          local_2660._8_4_ = local_2660._4_4_;
          local_2660._12_4_ = local_2660._4_4_;
          local_2660._16_4_ = local_2660._4_4_;
          local_2660._20_4_ = local_2660._4_4_;
          local_2660._24_4_ = local_2660._4_4_;
          local_2660._28_4_ = local_2660._4_4_;
          local_2640._4_4_ = local_2bd8->user->instPrimID[0];
          local_2640._0_4_ = local_2640._4_4_;
          local_2640._8_4_ = local_2640._4_4_;
          local_2640._12_4_ = local_2640._4_4_;
          local_2640._16_4_ = local_2640._4_4_;
          local_2640._20_4_ = local_2640._4_4_;
          local_2640._24_4_ = local_2640._4_4_;
          local_2640._28_4_ = local_2640._4_4_;
          auVar43 = *(undefined1 (*) [32])(ray + 0x100);
          auVar64 = vblendvps_avx(auVar43,auVar56,auVar65);
          *(undefined1 (*) [32])(ray + 0x100) = auVar64;
          local_2b10.valid = (int *)local_2ac0;
          local_2b10.geometryUserPtr = pGVar32->userPtr;
          local_2b10.context = local_2bd8->user;
          local_2b10.hit = (RTCHitN *)&local_2740;
          local_2b10.N = 8;
          pGVar31 = pGVar32;
          local_2b10.ray = (RTCRayN *)ray;
          local_2ac0 = auVar65;
          local_2680 = uVar36;
          uStack_267c = uVar36;
          uStack_2678 = uVar36;
          uStack_2674 = uVar36;
          uStack_2670 = uVar36;
          uStack_266c = uVar36;
          uStack_2668 = uVar36;
          uStack_2664 = uVar36;
          if (pGVar32->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar65 = ZEXT1632(auVar63._0_16_);
            local_2bc8 = uVar34;
            local_2ae0 = auVar43;
            (*pGVar32->occlusionFilterN)(&local_2b10);
            auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
            auVar87 = ZEXT3264(auVar65);
            auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            pGVar31 = pGVar32;
            uVar34 = local_2bc8;
            auVar43 = local_2ae0;
          }
          auVar65 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2ac0);
          auVar63 = auVar87._0_32_ & ~auVar65;
          if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar63 >> 0x7f,0) == '\0') &&
                (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar63 >> 0xbf,0) == '\0') &&
              (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar63[0x1f]) {
            auVar65 = auVar65 ^ auVar87._0_32_;
            auVar49 = ZEXT3264(local_2ba0);
          }
          else {
            pGVar32 = (Geometry *)local_2bd8->args;
            auVar49 = ZEXT3264(local_2ba0);
            pGVar31 = pGVar32;
            if ((pGVar32->device != (Device *)0x0) &&
               ((((ulong)(pGVar32->super_RefCount)._vptr_RefCount & 2) != 0 ||
                (pGVar31 = (Geometry *)local_2b80._0_8_,
                (((anon_struct_4_6_abad0318_for_Geometry_10 *)(local_2b80._0_8_ + 0x3c))->field_0x2
                & 0x40) != 0)))) {
              auVar65 = ZEXT1632(auVar87._0_16_);
              local_2bc8 = uVar34;
              local_2ae0 = auVar43;
              (*(code *)pGVar32->device)(&local_2b10);
              auVar49 = ZEXT3264(local_2ba0);
              auVar65 = vpcmpeqd_avx2(auVar65,auVar65);
              auVar87 = ZEXT3264(auVar65);
              auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              uVar34 = local_2bc8;
              auVar43 = local_2ae0;
            }
            auVar63 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2ac0);
            auVar65 = auVar63 ^ auVar87._0_32_;
            auVar57._8_4_ = 0xff800000;
            auVar57._0_8_ = 0xff800000ff800000;
            auVar57._12_4_ = 0xff800000;
            auVar57._16_4_ = 0xff800000;
            auVar57._20_4_ = 0xff800000;
            auVar57._24_4_ = 0xff800000;
            auVar57._28_4_ = 0xff800000;
            auVar63 = vblendvps_avx(auVar57,*(undefined1 (*) [32])(local_2b10.ray + 0x100),auVar63);
            *(undefined1 (*) [32])(local_2b10.ray + 0x100) = auVar63;
          }
          auVar43 = vblendvps_avx(auVar43,*(undefined1 (*) [32])local_2bf8,auVar65);
          *(undefined1 (*) [32])local_2bf8 = auVar43;
        }
        auVar65 = vandnps_avx(auVar65,local_2bc0);
        pGVar32 = pGVar31;
        uVar29 = local_2bd0;
      }
      auVar43 = auVar49._0_32_;
      if (((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              SUB321(auVar65 >> 0x7f,0) == '\0') &&
             (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            SUB321(auVar65 >> 0xbf,0) == '\0') &&
           (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar65[0x1f]
          ) || (bVar39 = 2 < uVar38, uVar38 = uVar38 + 1, bVar39)) break;
    }
    local_2ba0 = vandps_avx(auVar65,auVar43);
    auVar43 = auVar43 & auVar65;
    if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar43 >> 0x7f,0) == '\0') &&
          (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar43 >> 0xbf,0) == '\0') &&
        (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar43[0x1f])
    break;
  }
  local_2b40._0_4_ = local_2ba0._0_4_ ^ auVar87._0_4_;
  local_2b40._4_4_ = local_2ba0._4_4_ ^ auVar87._4_4_;
  local_2b40._8_4_ = local_2ba0._8_4_ ^ auVar87._8_4_;
  local_2b40._12_4_ = local_2ba0._12_4_ ^ auVar87._12_4_;
  local_2b40._16_4_ = local_2ba0._16_4_ ^ auVar87._16_4_;
  local_2b40._20_4_ = local_2ba0._20_4_ ^ auVar87._20_4_;
  local_2b40._24_4_ = local_2ba0._24_4_ ^ auVar87._24_4_;
  local_2b40._28_4_ = local_2ba0._28_4_ ^ auVar87._28_4_;
  auVar65 = local_29c0;
LAB_005ae7e3:
  auVar49 = ZEXT3264(auVar65);
  local_2b40 = vpor_avx2(auVar65,local_2b40);
  auVar65 = auVar87._0_32_ & ~local_2b40;
  if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar65 >> 0x7f,0) == '\0') &&
        (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar65 >> 0xbf,0) == '\0') &&
      (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar65[0x1f]) {
LAB_005ae81c:
    iVar28 = 3;
  }
  else {
    auVar49 = ZEXT3264(local_2760);
    auVar58._8_4_ = 0xff800000;
    auVar58._0_8_ = 0xff800000ff800000;
    auVar58._12_4_ = 0xff800000;
    auVar58._16_4_ = 0xff800000;
    auVar58._20_4_ = 0xff800000;
    auVar58._24_4_ = 0xff800000;
    auVar58._28_4_ = 0xff800000;
    local_2760 = vblendvps_avx(local_2760,auVar58,local_2b40);
    iVar28 = 0;
  }
LAB_005ae81f:
  if (iVar28 == 3) {
    auVar65 = vandps_avx(local_2980,local_2b40);
    auVar48._8_4_ = 0xff800000;
    auVar48._0_8_ = 0xff800000ff800000;
    auVar48._12_4_ = 0xff800000;
    auVar48._16_4_ = 0xff800000;
    auVar48._20_4_ = 0xff800000;
    auVar48._24_4_ = 0xff800000;
    auVar48._28_4_ = 0xff800000;
    auVar65 = vmaskmovps_avx(auVar65,auVar48);
    *(undefined1 (*) [32])local_2bf8 = auVar65;
    return;
  }
  goto LAB_005ade59;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }